

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void __thiscall IrSim::getFunctions(IrSim *this,vector<int,_std::allocator<int>_> *f)

{
  undefined8 in_RAX;
  _Base_ptr p_Var1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  for (p_Var1 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->functions)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::vector<int,_std::allocator<int>_>::push_back(f,(value_type_conflict1 *)(p_Var1 + 1));
  }
  uStack_28 = CONCAT44((int)(((long)(this->irList).
                                    super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->irList).
                                   super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl
                                   .super__Vector_impl_data._M_start) / 0x98),(undefined4)uStack_28)
  ;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(f,(int *)((long)&uStack_28 + 4));
  return;
}

Assistant:

void IrSim::getFunctions(vector<int> &f) {
    for (auto &i : functions)
        f.push_back(i);
    f.push_back((int)irList.size());
}